

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_urlencode.cpp
# Opt level: O0

string * urlencode(string *__return_storage_ptr__,string *c)

{
  char *pcVar1;
  ulong uVar2;
  string local_58;
  int local_24;
  int local_20;
  int i;
  int max;
  string *c_local;
  string *escaped;
  
  i._3_1_ = 0;
  _max = c;
  c_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_20 = std::__cxx11::string::length();
  for (local_24 = 0; local_24 < local_20; local_24 = local_24 + 1) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)c);
    if (((((*pcVar1 < '0') ||
          (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)c), '9' < *pcVar1)) &&
         ((pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)c), *pcVar1 < 'A' ||
          (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)c), 'Z' < *pcVar1)))) &&
        ((((pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)c), *pcVar1 < 'a' ||
           (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)c), 'z' < *pcVar1)) &&
          (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)c), *pcVar1 != '~')) &&
         ((pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)c), *pcVar1 != '-' &&
          (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)c), *pcVar1 != '_')))))) &&
       (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)c), *pcVar1 != '.')) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)c);
      char2hex_abi_cxx11_(&local_58,*pcVar1);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_58);
    }
    else {
      uVar2 = std::__cxx11::string::operator[]((ulong)c);
      std::__cxx11::string::append((char *)__return_storage_ptr__,uVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string urlencode( const std::string c)
{ 
	std::string escaped;
	int max = c.length();
	for(int i=0; i<max; i++)
	{
		if ( (48 <= c[i] && c[i] <= 57) ||   //0-9
			(65 <= c[i] && c[i] <= 90) ||      //ABC...XYZ
			(97 <= c[i] && c[i] <= 122) ||     //abc...xyz
			(c[i]=='~' || c[i]=='-' || c[i]=='_' || c[i]=='.')
			)
		{
			escaped.append( &c[i], 1);
		}
		else
		{
			escaped.append("%");
			escaped.append( char2hex(c[i]) );//converts char 255 to string "FF"
		}
	}
	return escaped;
}